

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O3

_Bool tval_is_sharp_missile(object *obj)

{
  return (byte)(obj->tval - 3) < 2;
}

Assistant:

bool tval_is_sharp_missile(const struct object *obj)
{
	switch (obj->tval) {
		case TV_ARROW:
		case TV_BOLT:
			return true;
		default:
			return false;
	}
}